

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

int Gia_ManSortByValue(Gia_Obj_t **pp1,Gia_Obj_t **pp2)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  iVar2 = *(int *)(((ulong)*pp1 & 0xfffffffffffffffe) + 8);
  iVar1 = *(int *)(((ulong)*pp2 & 0xfffffffffffffffe) + 8);
  uVar3 = 0xffffffff;
  if (-1 < iVar2 - iVar1) {
    uVar3 = (uint)(iVar2 != iVar1);
  }
  return uVar3;
}

Assistant:

int Gia_ManSortByValue( Gia_Obj_t ** pp1, Gia_Obj_t ** pp2 )
{
    int Diff = Gia_Regular(*pp1)->Value - Gia_Regular(*pp2)->Value;
    if ( Diff < 0 )
        return -1;
    if ( Diff > 0 ) 
        return 1;
    return 0; 
}